

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

void __thiscall czh::node::Node::NodeData::NodeData(NodeData *this,NodeData *nd)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  char *__end;
  int e;
  string local_128;
  list<czh::node::Node,_std::allocator<czh::node::Node>_> *local_108;
  int local_fc;
  Node local_f8;
  
  p_Var1 = &(this->index)._M_t._M_impl.super__Rb_tree_header;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108 = &this->nodes;
  (this->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_108;
  (this->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_108;
  (this->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl._M_node.
  _M_size = 0;
  p_Var2 = (nd->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&nd->nodes) {
    do {
      Node(&local_f8,(Node *)(p_Var2 + 1));
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"","");
      add(this,&local_f8,&local_128,&local_fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_f8.czh_token.pos.code.
          super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.czh_token.pos.code.
                   super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      std::__detail::__variant::
      _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&local_f8.czh_token.what);
      std::__detail::__variant::
      _Variant_storage<false,_czh::node::Node::NodeData,_czh::value::Value>::~_Variant_storage
                ((_Variant_storage<false,_czh::node::Node::NodeData,_czh::value::Value> *)
                 &local_f8.data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
        operator_delete(local_f8.name._M_dataplus._M_p,
                        local_f8.name.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&nd->nodes);
  }
  return;
}

Assistant:

NodeData(NodeData &&nd)
      {
        for (auto &r: nd.nodes)
        {
          int e;
          add(std::move(r), "", e);
        }
      }